

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::ConnectHttpService::SimpleHttpService::request
          (SimpleHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  AsyncOutputStream *pAVar1;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> AVar2;
  undefined8 *in_stack_00000010;
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_e8 [2];
  Maybe<unsigned_long> local_c8;
  HttpHeaders local_b8;
  ArrayPtr<const_char> local_58;
  undefined1 local_48 [8];
  Own<kj::AsyncOutputStream,_std::nullptr_t> out;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  SimpleHttpService *this_local;
  StringPtr url_local;
  
  out.ptr = (AsyncOutputStream *)requestBody;
  local_58 = (ArrayPtr<const_char>)operator____kj("OK",2);
  HttpHeaders::HttpHeaders
            (&local_b8,*(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
  Maybe<unsigned_long>::Maybe(&local_c8);
  (**(code **)*in_stack_00000010)
            (local_48,in_stack_00000010,200,local_58.ptr,local_58.size_,&local_b8,&local_c8);
  Maybe<unsigned_long>::~Maybe(&local_c8);
  HttpHeaders::~HttpHeaders(&local_b8);
  pAVar1 = Own<kj::AsyncOutputStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  AVar2 = operator___kjb<kj::_::ByteLiteral<12UL>__104,_101,_108,_108,_111,_32,_116,_104,_101,_114,______>
                    ();
  (**pAVar1->_vptr_AsyncOutputStream)(local_e8,pAVar1,AVar2.ptr,AVar2.size_);
  mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,local_e8);
  Promise<void>::~Promise((Promise<void> *)local_e8);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
        HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
        kj::AsyncInputStream& requestBody, Response& response) override {
      auto out = response.send(200, "OK"_kj, HttpHeaders(table));
      return out->write("hello there"_kjb).attach(kj::mv(out));
    }